

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RWBBlock.h
# Opt level: O2

pair<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>,_std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>_>
 __thiscall dg::dda::RWBBlock::splitAround(RWBBlock *this,NodeT *node)

{
  pointer *this_00;
  RWSubgraph *pRVar1;
  long *plVar2;
  long *plVar3;
  pointer *pppRVar4;
  RWBBlock *s;
  RWBBlock *s_00;
  long *plVar5;
  __uniq_ptr_impl<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_> in_RDX;
  long *plVar6;
  tuple<dg::dda::RWBBlock_*,_std::default_delete<dg::dda::RWBBlock>_> extraout_RDX;
  int iVar7;
  size_type __new_size;
  RWBBlock *pRVar8;
  ElemWithEdges<dg::dda::RWBBlock> *this_01;
  RWNode *pRVar9;
  pair<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>,_std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>_>
  pVar10;
  __uniq_ptr_impl<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_> local_40;
  __uniq_ptr_impl<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_> local_38;
  
  if ((node->super_SubgraphNode<dg::dda::RWNode>)._predecessors.
      super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
      super__Vector_impl_data._M_finish == (pointer)0x1) {
    *(undefined8 *)
     &(this->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).
      super_CFGElement<dg::dda::RWBBlock> = 0;
    (this->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).super_CFGElement<dg::dda::RWBBlock>
    .super_ElemWithEdges<dg::dda::RWBBlock>._successors.
    super__Vector_base<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    goto LAB_0011cf78;
  }
  this_00 = &(node->super_SubgraphNode<dg::dda::RWNode>)._successors.
             super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  iVar7 = 0;
  pppRVar4 = this_00;
  while ((pppRVar4 = (pointer *)*pppRVar4, pppRVar4 != this_00 &&
         ((tuple<dg::dda::RWBBlock_*,_std::default_delete<dg::dda::RWBBlock>_>)pppRVar4[2] !=
          (_Tuple_impl<0UL,_dg::dda::RWBBlock_*,_std::default_delete<dg::dda::RWBBlock>_>)
          in_RDX._M_t.
          super__Tuple_impl<0UL,_dg::dda::RWBBlock_*,_std::default_delete<dg::dda::RWBBlock>_>.
          super__Head_base<0UL,_dg::dda::RWBBlock_*,_false>._M_head_impl))) {
    iVar7 = iVar7 + -1;
  }
  pRVar9 = (RWNode *)*pppRVar4;
  if (pRVar9 == (RWNode *)this_00) {
    s = (RWBBlock *)0x0;
  }
  else {
    s = (RWBBlock *)operator_new(0x58);
    pRVar1 = (RWSubgraph *)
             (node->super_SubgraphNode<dg::dda::RWNode>)._predecessors.
             super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>::BBlockBase
              ((BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode> *)s);
    s->subgraph = pRVar1;
    for (; pRVar9 != (RWNode *)this_00; pRVar9 = (RWNode *)pRVar9->_vptr_RWNode) {
      BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>::append
                ((BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode> *)s,
                 *(RWNode **)((long)&pRVar9->super_SubgraphNode<dg::dda::RWNode> + 8));
    }
  }
  if (iVar7 == 0) {
    __new_size = 1;
    s_00 = (RWBBlock *)0x0;
  }
  else {
    s_00 = (RWBBlock *)operator_new(0x58);
    pRVar1 = (RWSubgraph *)
             (node->super_SubgraphNode<dg::dda::RWNode>)._predecessors.
             super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>::BBlockBase
              ((BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode> *)s_00);
    s_00->subgraph = pRVar1;
    BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>::append
              ((BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode> *)s_00,
               (RWNode *)
               in_RDX._M_t.
               super__Tuple_impl<0UL,_dg::dda::RWBBlock_*,_std::default_delete<dg::dda::RWBBlock>_>.
               super__Head_base<0UL,_dg::dda::RWBBlock_*,_false>._M_head_impl);
    __new_size = (size_type)(uint)-iVar7;
  }
  std::__cxx11::list<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>::resize
            ((list<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *)this_00,__new_size);
  pRVar8 = s;
  if (s == (RWBBlock *)0x0) {
    pRVar8 = s_00;
  }
  this_01 = (ElemWithEdges<dg::dda::RWBBlock> *)&node->super_SubgraphNode<dg::dda::RWNode>;
  plVar2 = (long *)(node->super_SubgraphNode<dg::dda::RWNode>).data;
  for (plVar5 = *(long **)&node->super_SubgraphNode<dg::dda::RWNode>; plVar5 != plVar2;
      plVar5 = plVar5 + 1) {
    plVar3 = *(long **)(*plVar5 + 0x28);
    for (plVar6 = *(long **)(*plVar5 + 0x20); plVar6 != plVar3; plVar6 = plVar6 + 1) {
      if ((NodeT *)*plVar6 == node) {
        *plVar6 = (long)pRVar8;
      }
    }
  }
  std::_Vector_base<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>::_Vector_impl_data::
  _M_swap_data((_Vector_impl_data *)
               &(pRVar8->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).
                super_CFGElement<dg::dda::RWBBlock>.super_ElemWithEdges<dg::dda::RWBBlock>,
               (_Vector_impl_data *)this_01);
  if (s_00 == (RWBBlock *)0x0) {
LAB_0011cf47:
    ElemWithEdges<dg::dda::RWBBlock>::addSuccessor(this_01,s);
  }
  else {
    ElemWithEdges<dg::dda::RWBBlock>::addSuccessor(this_01,s_00);
    if (s != (RWBBlock *)0x0) {
      this_01 = &(s_00->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).
                 super_CFGElement<dg::dda::RWBBlock>.super_ElemWithEdges<dg::dda::RWBBlock>;
      goto LAB_0011cf47;
    }
  }
  *(RWBBlock **)
   &(this->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).super_CFGElement<dg::dda::RWBBlock>
       = s_00;
  local_38._M_t.super__Tuple_impl<0UL,_dg::dda::RWBBlock_*,_std::default_delete<dg::dda::RWBBlock>_>
  .super__Head_base<0UL,_dg::dda::RWBBlock_*,_false>._M_head_impl =
       (tuple<dg::dda::RWBBlock_*,_std::default_delete<dg::dda::RWBBlock>_>)
       (_Tuple_impl<0UL,_dg::dda::RWBBlock_*,_std::default_delete<dg::dda::RWBBlock>_>)0x0;
  (this->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).super_CFGElement<dg::dda::RWBBlock>.
  super_ElemWithEdges<dg::dda::RWBBlock>._successors.
  super__Vector_base<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)s;
  local_40._M_t.super__Tuple_impl<0UL,_dg::dda::RWBBlock_*,_std::default_delete<dg::dda::RWBBlock>_>
  .super__Head_base<0UL,_dg::dda::RWBBlock_*,_false>._M_head_impl =
       (tuple<dg::dda::RWBBlock_*,_std::default_delete<dg::dda::RWBBlock>_>)
       (_Tuple_impl<0UL,_dg::dda::RWBBlock_*,_std::default_delete<dg::dda::RWBBlock>_>)0x0;
  std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>::~unique_ptr
            ((unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_> *)&local_40);
  std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>::~unique_ptr
            ((unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_> *)&local_38);
  in_RDX._M_t.super__Tuple_impl<0UL,_dg::dda::RWBBlock_*,_std::default_delete<dg::dda::RWBBlock>_>.
  super__Head_base<0UL,_dg::dda::RWBBlock_*,_false>._M_head_impl =
       (tuple<dg::dda::RWBBlock_*,_std::default_delete<dg::dda::RWBBlock>_>)
       (tuple<dg::dda::RWBBlock_*,_std::default_delete<dg::dda::RWBBlock>_>)
       extraout_RDX.
       super__Tuple_impl<0UL,_dg::dda::RWBBlock_*,_std::default_delete<dg::dda::RWBBlock>_>.
       super__Head_base<0UL,_dg::dda::RWBBlock_*,_false>._M_head_impl;
LAB_0011cf78:
  pVar10.second._M_t.
  super___uniq_ptr_impl<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>._M_t.
  super__Tuple_impl<0UL,_dg::dda::RWBBlock_*,_std::default_delete<dg::dda::RWBBlock>_>.
  super__Head_base<0UL,_dg::dda::RWBBlock_*,_false>._M_head_impl =
       (__uniq_ptr_data<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>,_true,_true>)
       (__uniq_ptr_data<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>,_true,_true>)
       in_RDX._M_t.
       super__Tuple_impl<0UL,_dg::dda::RWBBlock_*,_std::default_delete<dg::dda::RWBBlock>_>.
       super__Head_base<0UL,_dg::dda::RWBBlock_*,_false>._M_head_impl;
  pVar10.first._M_t.
  super___uniq_ptr_impl<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>._M_t.
  super__Tuple_impl<0UL,_dg::dda::RWBBlock_*,_std::default_delete<dg::dda::RWBBlock>_>.
  super__Head_base<0UL,_dg::dda::RWBBlock_*,_false>._M_head_impl =
       (__uniq_ptr_data<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>,_true,_true>)
       (__uniq_ptr_data<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>,_true,_true>)this;
  return pVar10;
}

Assistant:

std::pair<std::unique_ptr<RWBBlock>, std::unique_ptr<RWBBlock>>
    splitAround(NodeT *node) {
        assert(node->getBBlock() == this && "Spliting a block on invalid node");

        RWBBlock *withnode = nullptr;
        RWBBlock *after = nullptr;

        if (getNodes().size() == 1) {
            assert(*getNodes().begin() == node);
            return {nullptr, nullptr};
        }

#ifndef NDEBUG
        auto old_size = getNodes().size();
        assert(old_size > 1);
#endif
        unsigned num = 0;
        auto it = getNodes().begin(), et = getNodes().end();
        for (; it != et; ++it) {
            if (*it == node) {
                break;
            }
            ++num;
        }

        assert(it != et && "Did not find the node");
        assert(*it == node);

        ++it;
        if (it != et) {
            after = new RWBBlock(subgraph);
            for (; it != et; ++it) {
                after->append(*it);
            }
        }

        // truncate nodes in this block
        if (num > 0) {
            withnode = new RWBBlock(subgraph);
            withnode->append(node);

            getNodes().resize(num);
        } else {
            assert(*getNodes().begin() == node);
            assert(after && "Should have a suffix");
            getNodes().resize(1);
        }

        assert(!withnode || withnode->size() == 1);
        assert(((getNodes().size() + (withnode ? withnode->size() : 0) +
                 (after ? after->size() : 0)) == old_size) &&
               "Bug in splitting nodes");

        // reconnect edges
        RWBBlock *bbwithsuccessors = after;
        if (!bbwithsuccessors) // no suffix
            bbwithsuccessors = withnode;

        assert(bbwithsuccessors);
        for (auto *s : this->_successors) {
            for (auto &p : s->_predecessors) {
                if (p == this) {
                    p = bbwithsuccessors;
                }
            }
        }
        // swap this and after successors
        bbwithsuccessors->_successors.swap(this->_successors);

        if (withnode) {
            this->addSuccessor(withnode);
            if (after) {
                withnode->addSuccessor(after);
            }
        } else {
            assert(after && "Should have a suffix");
            this->addSuccessor(after);
        }

        return {std::unique_ptr<RWBBlock>(withnode),
                std::unique_ptr<RWBBlock>(after)};
    }